

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O1

bool __thiscall LTFlightData::TryDeriveGrndStatus(LTFlightData *this,positionTy *pos)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  byte unaff_BPL;
  double dVar4;
  double dVar5;
  unique_lock<std::recursive_mutex> lock;
  LTChannel *pChn;
  unique_lock<std::recursive_mutex> local_38;
  LTChannel *local_28;
  
  local_38._M_device = &this->dataAccessMutex;
  iVar3 = pthread_mutex_trylock((pthread_mutex_t *)local_38._M_device);
  local_38._M_owns = iVar3 == 0;
  if (local_38._M_owns) {
    dVar4 = ::YProbe_at_m(pos,&this->probeRef);
    unaff_BPL = !NAN(dVar4);
    if (!NAN(dVar4)) {
      if (((ushort)pos->f & 0x300) != 0x200) {
        dVar1 = pos->_alt;
        local_28 = (LTChannel *)0x0;
        bVar2 = GetCurrChannel(this,&local_28);
        if (bVar2 && local_28 != (LTChannel *)0x0) {
          dVar5 = *(double *)
                   (&DAT_00251c90 + (ulong)(local_28->channel == DR_CHANNEL_REAL_TRAFFIC_ONLINE) * 8
                   );
        }
        else {
          dVar5 = 10.0;
        }
        if (dVar1 < dVar5 + dVar4) {
          pos->f = (posFlagsTy)((ushort)*(undefined4 *)&pos->f & 0xfcff | 0x200);
        }
      }
      if (((ushort)pos->f & 0x300) == 0x200) {
        pos->_alt = dVar4 + -0.5;
      }
      else {
        pos->f = (posFlagsTy)((ushort)pos->f & 0xfcff | 0x100);
      }
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
  if (iVar3 != 0) {
    unaff_BPL = 0;
  }
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool LTFlightData::TryDeriveGrndStatus (positionTy& pos)
{
    try {
        std::unique_lock<std::recursive_mutex> lock (dataAccessMutex, std::try_to_lock );
        if ( lock )
        {
            // what's the terrain altitude at that pos?
            double terrainAlt = YProbe_at_m(pos);
            if (std::isnan(terrainAlt))
                return false;
            
            // Now 2 options:
            // If position already says itself: I'm on the ground, then keep it like that
            // Otherwise decide based on altitude _if_ it's on the ground
            if (!pos.IsOnGnd() &&
                // say it's on the ground if below terrain+10m (or 20m in case of RealTraffic)
                pos.alt_m() < terrainAlt + (GetCurrChannel() == DR_CHANNEL_REAL_TRAFFIC_ONLINE ? FD_GND_AGL_EXT : FD_GND_AGL))
                pos.f.onGrnd = GND_ON;

            // if it was or now is on the ground correct the altitue to terrain altitude
            // (very slightly below to be sure to actually touch down even after rounding effects)
            if (pos.IsOnGnd())
                pos.alt_m() = terrainAlt - MDL_CLOSE_TO_GND;
            else
                // make sure it's either GND_ON or GND_OFF, nothing lese
                pos.f.onGrnd = GND_OFF;

            // successfully determined a status
            return true;
        }
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
    
    // Either didn't get the lock or some caught error
    return false;
}